

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  ostream *this_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  error_code local_178 [32];
  undefined4 local_158;
  undefined8 local_150;
  anon_class_1_0_00000001 local_141;
  function<void_(uv11::Stream_&,_const_uv11::Buffer_&,_long,_std::error_code)> local_140;
  anon_class_1_0_00000001 local_119;
  function<void_(uv11::Handle_&,_unsigned_long,_uv_buf_t_*)> local_118;
  anon_class_32_2_83574344 local_f8;
  function<void_(uv11::ConnectRequest_&,_std::error_code)> local_d8;
  undefined4 local_b8 [2];
  Error e;
  undefined1 local_98 [8];
  shared_ptr<uv11::ConnectRequest> connectRequest;
  shared_ptr<uv11::Tcp> tcp;
  sockaddr_in addr;
  anon_class_1_0_00000001 local_41;
  function<void_(uv11::GetAddrInfoRequest_&,_std::error_code,_uv11::UvAddrInfoPtr)> local_40;
  undefined1 local_20 [8];
  shared_ptr<uv11::GetAddrInfoRequest> addrRequest;
  
  addrRequest.super___shared_ptr<uv11::GetAddrInfoRequest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = 0;
  std::make_shared<uv11::GetAddrInfoRequest>();
  peVar2 = std::
           __shared_ptr_access<uv11::GetAddrInfoRequest,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<uv11::GetAddrInfoRequest,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_20);
  std::function<void(uv11::GetAddrInfoRequest&,std::error_code,uv11::UvAddrInfoPtr)>::
  function<main::__0,void>
            ((function<void(uv11::GetAddrInfoRequest&,std::error_code,uv11::UvAddrInfoPtr)> *)
             &local_40,&local_41);
  uv11::getaddrinfo((Loop *)&uv11::default_loop,peVar2,(function *)&local_40,"www.google.com",
                    (char *)0x0);
  std::function<void_(uv11::GetAddrInfoRequest_&,_std::error_code,_uv11::UvAddrInfoPtr)>::~function
            (&local_40);
  std::make_shared<uv11::Tcp>();
  std::make_shared<uv11::ConnectRequest>();
  uv11::ip4_addr("216.58.208.46",0x50,
                 (sockaddr_in *)
                 &tcp.super___shared_ptr<uv11::Tcp,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar3 = std::__shared_ptr_access<uv11::ConnectRequest,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<uv11::ConnectRequest,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_98);
  this = &connectRequest.super___shared_ptr<uv11::ConnectRequest,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  peVar4 = std::__shared_ptr_access<uv11::Tcp,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<uv11::Tcp,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  std::shared_ptr<uv11::Tcp>::shared_ptr(&local_f8.tcp,(shared_ptr<uv11::Tcp> *)this);
  std::shared_ptr<uv11::ConnectRequest>::shared_ptr
            (&local_f8.connectRequest,(shared_ptr<uv11::ConnectRequest> *)local_98);
  std::function<void(uv11::ConnectRequest&,std::error_code)>::function<main::__1,void>
            ((function<void(uv11::ConnectRequest&,std::error_code)> *)&local_d8,&local_f8);
  local_b8[0] = uv11::tcp_connect(peVar3,peVar4,
                                  (sockaddr *)
                                  &tcp.super___shared_ptr<uv11::Tcp,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount,(function *)&local_d8);
  _e = extraout_RDX;
  std::function<void_(uv11::ConnectRequest_&,_std::error_code)>::~function(&local_d8);
  main::$_1::~__1((__1 *)&local_f8);
  peVar4 = std::__shared_ptr_access<uv11::Tcp,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<uv11::Tcp,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &connectRequest.
                       super___shared_ptr<uv11::ConnectRequest,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  std::function<void(uv11::Handle&,unsigned_long,uv_buf_t*)>::function<main::__2,void>
            ((function<void(uv11::Handle&,unsigned_long,uv_buf_t*)> *)&local_118,&local_119);
  std::function<void(uv11::Stream&,uv11::Buffer_const&,long,std::error_code)>::
  function<main::__3,void>
            ((function<void(uv11::Stream&,uv11::Buffer_const&,long,std::error_code)> *)&local_140,
             &local_141);
  local_158 = uv11::read_start((Stream *)peVar4,(function *)&local_118,(function *)&local_140);
  local_150 = extraout_RDX_00;
  std::function<void_(uv11::Stream_&,_const_uv11::Buffer_&,_long,_std::error_code)>::~function
            (&local_140);
  std::function<void_(uv11::Handle_&,_unsigned_long,_uv_buf_t_*)>::~function(&local_118);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_b8);
  if (bVar1) {
    std::error_code::message_abi_cxx11_(local_178);
    this_00 = std::operator<<((ostream *)&std::cout,(string *)local_178);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_178);
  }
  addrRequest.super___shared_ptr<uv11::GetAddrInfoRequest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = uv11::run(&uv11::default_loop,0);
  std::shared_ptr<uv11::ConnectRequest>::~shared_ptr((shared_ptr<uv11::ConnectRequest> *)local_98);
  std::shared_ptr<uv11::Tcp>::~shared_ptr
            ((shared_ptr<uv11::Tcp> *)
             &connectRequest.super___shared_ptr<uv11::ConnectRequest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<uv11::GetAddrInfoRequest>::~shared_ptr
            ((shared_ptr<uv11::GetAddrInfoRequest> *)local_20);
  return addrRequest.super___shared_ptr<uv11::GetAddrInfoRequest,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._4_4_;
}

Assistant:

int main() {

    auto addrRequest = std::make_shared<uv11::GetAddrInfoRequest>();
    uv11::getaddrinfo(
        uv11::default_loop,
        *addrRequest,
        [] (uv11::GetAddrInfoRequest&, uv11::Error e, uv11::UvAddrInfoPtr res) {
            if (e) {
                std::cout << "Addr info error: " << e.message() << std::endl;
            } else {
                std::string ip;
                addrinfo& a = *res;
                while (true) {
                    void * in_addr;
                    if (a.ai_family == AF_INET) {
                        in_addr = &reinterpret_cast<sockaddr_in*>(a.ai_addr)->sin_addr;
                    } else if (a.ai_family == AF_INET6) {
                        in_addr = &reinterpret_cast<sockaddr_in6*>(a.ai_addr)->sin6_addr;
                    } else {
                        std::cout << "unrecognized family " << a.ai_family << std::endl;
                        break;
                    }

                    auto err = uv11::inet_ntop(
                        a.ai_family,
                        &reinterpret_cast<sockaddr_in*>(a.ai_addr)->sin_addr,
                        ip
                    );

                    if (err) {
                        std::cout << "Failed to parse " << err.message() << std::endl;
                        break;
                    }

                    auto p = ::getprotobynumber(a.ai_protocol);
                    std::cout << ((a.ai_family == AF_INET) ? "IPv4" : "IPv6") << " " << ip << " " << p->p_name<< std::endl;

                    if (a.ai_next) {
                        a = *a.ai_next;
                        continue;
                    } else {
                        break;
                    }
                }
            }
        },
        "www.google.com", nullptr
    );

    sockaddr_in addr;

    auto tcp = std::make_shared<uv11::Tcp>();
    auto connectRequest = std::make_shared<uv11::ConnectRequest>();

    uv11::ip4_addr("216.58.208.46", 80, addr);

    auto e = uv11::tcp_connect(
        *connectRequest, *tcp, reinterpret_cast<sockaddr&>(addr),
        [tcp, connectRequest] (uv11::ConnectRequest&, uv11::Error e) {
            std::cout << "Connected!" << std::endl;
            if (e) {
                std::cout << e.message() << std::endl;
            }

            auto write_req = std::make_shared<uv11::WriteRequest>();

            char temp[] =  "GET / HTTP/1.1\r\nContent-Length: 0\r\nConnection: Close\r\n\r\n";
            auto get_request = std::make_shared<std::vector<char>>(
                std::begin(temp), std::end(temp)
            );

            uv11::write(
                *write_req,
                *tcp,
                uv11::make_buffer(*get_request),
                [tcp, write_req, get_request] (uv11::WriteRequest&, uv11::Error e) {
                    std::cout << "written" << std::endl;
                    if (e) {
                        std::cout << "Write error: " << e.message() << std::endl;
                    }
                }
            );
        }
    );

    uv11::read_start(
        *tcp,
        [] (uv11::Handle&, std::size_t suggested_size, uv11::uv_buf_t* buf) {
            buf->base = new char[suggested_size];
            buf->len = suggested_size;
        },
        [](uv11::Stream&, uv11::Buffer const& buf, ::ssize_t nread, uv11::Error e) {
            if (e) {
                std::cout << "Read error: " << e.message() << std::endl;
            } else {
                std::cout.write(buf.base, nread);
                std::cout << std::endl;
            }

            delete[] buf.base;
        });

    if (e) {
        std::cout << e.message() << std::endl;
    }

    return uv11::run(uv11::default_loop, uv11::RunMode::UV_RUN_DEFAULT);
}